

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.h
# Opt level: O0

bool __thiscall
dg::legacy::DataFlowAnalysis<dg::LLVMNode>::runOnBlock
          (DataFlowAnalysis<dg::LLVMNode> *this,BBlock<dg::LLVMNode> *B)

{
  LLVMNode *pLVar1;
  bool bVar2;
  byte bVar3;
  reference ppLVar4;
  BBlock<dg::LLVMNode> *in_RSI;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *in_RDI;
  LLVMNode *n;
  iterator __end0;
  iterator __begin0;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *__range3;
  LLVMNode *prev;
  bool changed;
  _Self local_38;
  _Self local_30;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *local_28;
  LLVMNode *local_20;
  byte local_11;
  
  local_11 = 0;
  local_20 = (LLVMNode *)0x0;
  local_28 = BBlock<dg::LLVMNode>::getNodes_abi_cxx11_(in_RSI);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::begin(in_RDI);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::end(in_RDI);
  while( true ) {
    bVar2 = std::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    ppLVar4 = std::_List_iterator<dg::LLVMNode_*>::operator*
                        ((_List_iterator<dg::LLVMNode_*> *)0x1a1f91);
    pLVar1 = *ppLVar4;
    bVar3 = (*(code *)((in_RDI->super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>).
                       _M_impl._M_node.super__List_node_base._M_next)->_M_prev)
                      (in_RDI,pLVar1,local_20);
    local_11 = (local_11 & 1) != 0 || (bVar3 & 1) != 0;
    local_20 = pLVar1;
    std::_List_iterator<dg::LLVMNode_*>::operator++(&local_30);
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool runOnBlock(BBlock<NodeT> *B) override {
        bool changed = false;
        NodeT *prev = nullptr;

        for (NodeT *n : B->getNodes()) {
            changed |= runOnNode(n, prev);
            prev = n;
        }

        return changed;
    }